

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::TessellationTests::init(TessellationTests *this,EVP_PKEY_CTX *ctx)

{
  IOType IVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  _Alloc_hider _Var4;
  bool *__s;
  int extraout_EAX;
  TestNode *pTVar5;
  TestNode *pTVar6;
  undefined8 *puVar7;
  long *plVar8;
  TestNode *pTVar9;
  BasicVariousTessLevelsPosAttrCase *pBVar10;
  ulong uVar11;
  TestNode *pTVar12;
  TestNode *pTVar13;
  UserDefinedIOCase *pUVar14;
  TestNode *node;
  size_type *psVar15;
  ulong *puVar16;
  char *description;
  long *plVar17;
  ulong uVar18;
  undefined **ppuVar19;
  ulong uVar20;
  undefined1 uVar21;
  int spacingI;
  SpacingMode SVar22;
  int iVar23;
  int *piVar24;
  undefined8 uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  bool *pbVar29;
  char *__end;
  char *pcVar30;
  int iVar31;
  TessPrimitiveType TVar32;
  bool bVar33;
  string primSpacName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string caseName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string caseName;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_330;
  long lStack_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  TestNode *local_2d0;
  UserDefinedIOCase *local_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  long lStack_2a8;
  TestNode *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  ulong *local_278;
  long local_270;
  ulong local_268;
  long lStack_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  TestNode *local_218;
  TestNode *local_210;
  TestNode *local_208;
  TestNode *local_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  TestNode *local_1d8;
  TestNode *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  bool *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "Query tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_patch_vertices","Test MAX_PATCH_VERTICES");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x2000008e7d;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_gen_level","Test MAX_TESS_GEN_LEVEL");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x4000008e7e;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_uniform_components",
             "Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x40000008e7f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_uniform_components",
             "Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x40000008e80;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_texture_image_units",
             "Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x1000008e81;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_texture_image_units",
             "Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x1000008e82;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_output_components",
             "Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x4000008e83;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_patch_components",
             "Test MAX_TESS_PATCH_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x7800008e84;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_total_output_components",
             "Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x80000008e85;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_output_components",
             "Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x4000008e86;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_uniform_blocks",
             "Test MAX_TESS_CONTROL_UNIFORM_BLOCKS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0xc00008e89;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_uniform_blocks",
             "Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0xc00008e8a;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_input_components",
             "Test MAX_TESS_CONTROL_INPUT_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x400000886c;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_input_components",
             "Test MAX_TESS_EVALUATION_INPUT_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x400000886d;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_atomic_counter_buffers",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x92cd;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_atomic_counter_buffers",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x92ce;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_atomic_counters",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTERS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x92d3;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_atomic_counters",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x92d4;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_image_uniforms",
             "Test MAX_TESS_CONTROL_IMAGE_UNIFORMS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x90cb;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_image_uniforms",
             "Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x90cc;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_control_shader_storage_blocks",
             "Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x90d8;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_tess_evaluation_shader_storage_blocks",
             "Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x90d9;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_uniform_buffer_bindings",
             "Test MAX_UNIFORM_BUFFER_BINDINGS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x4800008a2f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_combined_uniform_blocks",
             "Test MAX_COMBINED_UNIFORM_BLOCKS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x3c00008a2e;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_combined_texture_image_units",
             "Test MAX_COMBINED_TEXTURE_IMAGE_UNITS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b528;
  pTVar6[1].m_testCtx = (TestContext *)0x6000008b4d;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_combined_tess_control_uniform_components",
             "Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b578;
  pTVar6[1].m_testCtx = (TestContext *)0x8e8900008e1e;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0x8e7f;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x88);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"max_combined_tess_evaluation_uniform_components",
             "Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b578;
  pTVar6[1].m_testCtx = (TestContext *)0x8e8a00008e1f;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0x8e80;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"primitive_restart_for_patches_supported",
             "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b5c8;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"patch_vertices","Test PATCH_VERTICES");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b618;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"tess_control_output_vertices",
             "Test TESS_CONTROL_OUTPUT_VERTICES");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b668;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar6,pCVar2->m_testCtx,"tess_gen_mode","Test TESS_GEN_MODE")
  ;
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b6d0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"tess_gen_spacing","Test TESS_GEN_SPACING");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b768;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"tess_gen_vertex_order",
             "Test TESS_GEN_VERTEX_ORDER");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b820;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"tess_gen_point_mode","Test TESS_GEN_POINT_MODE");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b8b8;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"referenced_by_tess_control_shader",
             "Test REFERENCED_BY_TESS_CONTROL_SHADER");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b940;
  *(undefined1 *)&pTVar6[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,pCVar2->m_testCtx,"referenced_by_tess_evaluation_shader",
             "Test REFERENCED_BY_TESS_EVALUATION_SHADER");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b940;
  *(undefined1 *)&pTVar6[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar6,pCVar2->m_testCtx,"is_per_patch","Test IS_PER_PATCH");
  pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_0219b990;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar2->m_testCtx,"tesscoord",
             "Get tessellation coordinates with transform feedback and validate them");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar2;
  local_2c8 = (UserDefinedIOCase *)pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  ppuVar19 = (undefined **)0x0;
  pTVar5 = (TestNode *)this;
  do {
    iVar31 = 0;
    local_2d0 = (TestNode *)ppuVar19;
    do {
      pTVar6 = (TestNode *)operator_new(0x90);
      pCVar2 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
      local_258 = &local_248;
      local_250 = 0;
      local_248 = local_248 & 0xffffffffffffff00;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      psVar15 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_298.field_2._M_allocated_capacity = *psVar15;
        local_298.field_2._8_8_ = puVar7[3];
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar15;
        local_298._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_298._M_string_length = puVar7[1];
      *puVar7 = psVar15;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_238.field_2._M_allocated_capacity = *psVar15;
        local_238.field_2._8_8_ = plVar8[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar15;
        local_238._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_238._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_1a8 = (bool *)&local_198;
      pbVar29 = (bool *)(plVar8 + 2);
      if ((bool *)*plVar8 == pbVar29) {
        local_198 = *(long *)pbVar29;
        lStack_190 = plVar8[3];
      }
      else {
        local_198 = *(long *)pbVar29;
        local_1a8 = (bool *)*plVar8;
      }
      local_1a0 = plVar8[1];
      *plVar8 = (long)pbVar29;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar6,pCVar2->m_testCtx,local_1a8,
                 glcts::fixed_sample_locations_values + 1);
      pTVar6[1]._vptr_TestNode = (_func_int **)pCVar2;
      pTVar6->_vptr_TestNode = (_func_int **)&PTR__TessCoordCase_0219b9e0;
      *(int *)&pTVar6[1].m_testCtx = (int)ppuVar19;
      *(int *)((long)&pTVar6[1].m_testCtx + 4) = iVar31;
      pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar6[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild((TestNode *)local_2c8,pTVar6);
      this = (TessellationTests *)pTVar5;
      if (local_1a8 != (bool *)&local_198) {
        operator_delete(local_1a8,local_198 + 1);
        this = (TessellationTests *)pTVar5;
      }
      pTVar5 = (TestNode *)this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      iVar31 = iVar31 + 1;
    } while (iVar31 != 3);
    uVar26 = (int)ppuVar19 + 1;
    ppuVar19 = (undefined **)(ulong)uVar26;
  } while (uVar26 != 3);
  pTVar6 = (TestNode *)operator_new(0x78);
  pp_Var3 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,(TestContext *)*pp_Var3,"winding",
             "Test the cw and ccw input layout qualifiers");
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar6[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  uVar26 = 0;
  do {
    if (uVar26 != 2) {
      local_2c8 = (UserDefinedIOCase *)(ulong)uVar26;
      iVar31 = 0;
      do {
        pTVar9 = (TestNode *)operator_new(0x90);
        pCVar2 = (Context *)pTVar5[1]._vptr_TestNode;
        local_258 = &local_248;
        local_250 = 0;
        local_248 = local_248 & 0xffffffffffffff00;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        psVar15 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_298.field_2._M_allocated_capacity = *psVar15;
          local_298.field_2._8_8_ = puVar7[3];
        }
        else {
          local_298.field_2._M_allocated_capacity = *psVar15;
          local_298._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_298._M_string_length = puVar7[1];
        *puVar7 = psVar15;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_238.field_2._M_allocated_capacity = *psVar15;
          local_238.field_2._8_8_ = plVar8[3];
        }
        else {
          local_238.field_2._M_allocated_capacity = *psVar15;
          local_238._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_238._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
        local_1a8 = (bool *)&local_198;
        pbVar29 = (bool *)(plVar8 + 2);
        if ((bool *)*plVar8 == pbVar29) {
          local_198 = *(long *)pbVar29;
          lStack_190 = plVar8[3];
        }
        else {
          local_198 = *(long *)pbVar29;
          local_1a8 = (bool *)*plVar8;
        }
        local_1a0 = plVar8[1];
        *plVar8 = (long)pbVar29;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar9,pCVar2->m_testCtx,local_1a8,
                   glcts::fixed_sample_locations_values + 1);
        pTVar9[1]._vptr_TestNode = (_func_int **)pCVar2;
        pTVar9->_vptr_TestNode = (_func_int **)&PTR__WindingCase_0219ba30;
        *(uint *)&pTVar9[1].m_testCtx = uVar26;
        *(int *)((long)&pTVar9[1].m_testCtx + 4) = iVar31;
        pTVar9[1].m_name._M_dataplus._M_p = (pointer)0x0;
        pTVar9[1].m_name._M_string_length = 0;
        tcu::TestNode::addChild(pTVar6,pTVar9);
        if (local_1a8 != (bool *)&local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258,local_248 + 1);
        }
        iVar31 = iVar31 + 1;
      } while (iVar31 == 1);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != 3);
  pTVar9 = (TestNode *)operator_new(0x78);
  pp_Var3 = pTVar5[1]._vptr_TestNode;
  pTVar6 = pTVar5;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"shader_input_output",
             "Test tessellation control and evaluation shader inputs and outputs");
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar9[1]._vptr_TestNode = pp_Var3;
  local_2c8 = (UserDefinedIOCase *)pTVar9;
  tcu::TestNode::addChild(pTVar5,pTVar9);
  lVar28 = 0;
  do {
    iVar31 = init::patchVertexCountCases[lVar28].inPatchSize;
    local_2d0 = (TestNode *)
                CONCAT44(local_2d0._4_4_,init::patchVertexCountCases[lVar28].outPatchSize);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    local_2a0 = (TestNode *)CONCAT44(local_2a0._4_4_,iVar31);
    std::ostream::operator<<((ostringstream *)&local_1a8,iVar31);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,0x1c9edb4);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    psVar15 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_2f0.field_2._M_allocated_capacity = *psVar15;
      local_2f0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar15;
      local_2f0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_2f0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_258 = &local_248;
    puVar16 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar16) {
      local_248 = *puVar16;
      lStack_240 = plVar8[3];
    }
    else {
      local_248 = *puVar16;
      local_258 = (ulong *)*plVar8;
    }
    local_250 = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<((ostringstream *)&local_1a8,(IOType)local_2d0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_258 != &local_248) {
      uVar11 = local_248;
    }
    if (uVar11 < local_310._M_string_length + local_250) {
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        uVar25 = local_310.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar25 < local_310._M_string_length + local_250) goto LAB_014156b5;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_258);
    }
    else {
LAB_014156b5:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_310._M_dataplus._M_p)
      ;
    }
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    psVar15 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_298.field_2._M_allocated_capacity = *psVar15;
      local_298.field_2._8_8_ = puVar7[3];
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar15;
      local_298._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_298._M_string_length = puVar7[1];
    *puVar7 = psVar15;
    puVar7[1] = 0;
    *(undefined1 *)psVar15 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    psVar15 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_238.field_2._M_allocated_capacity = *psVar15;
      local_238.field_2._8_8_ = plVar8[3];
    }
    else {
      local_238.field_2._M_allocated_capacity = *psVar15;
      local_238._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_238._M_string_length = plVar8[1];
    *plVar8 = (long)psVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)&local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    pTVar5 = (TestNode *)operator_new(0xb0);
    _Var4._M_p = local_238._M_dataplus._M_p;
    pp_Var3 = pTVar6[1]._vptr_TestNode;
    std::operator+(&local_298,"data/tessellation/",&local_238);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
    pbVar29 = (bool *)(plVar8 + 2);
    if ((bool *)*plVar8 == pbVar29) {
      local_198 = *(long *)pbVar29;
      lStack_190 = plVar8[3];
      local_1a8 = (bool *)&local_198;
    }
    else {
      local_198 = *(long *)pbVar29;
      local_1a8 = (bool *)*plVar8;
    }
    __s = local_1a8;
    local_1a0 = plVar8[1];
    *plVar8 = (long)pbVar29;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar5,(TestContext *)*pp_Var3,_Var4._M_p,
               "Test input and output patch vertex counts");
    pUVar14 = local_2c8;
    pTVar5[1]._vptr_TestNode = pp_Var3;
    pTVar5->_vptr_TestNode = (_func_int **)&PTR__PatchVertexCountCase_0219ba80;
    *(undefined4 *)&pTVar5[1].m_testCtx = local_2a0._0_4_;
    *(IOType *)((long)&pTVar5[1].m_testCtx + 4) = (IOType)local_2d0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pTVar5[1].m_name,__s,(allocator<char> *)&local_258);
    pTVar5[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar5[1].m_description._M_string_length = 0;
    tcu::TestNode::addChild((TestNode *)pUVar14,pTVar5);
    if (local_1a8 != (bool *)&local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 == 1);
  lVar28 = 0;
  uVar26 = 0;
  do {
    if (uVar26 < 10) {
      pcVar30 = (char *)((long)&DAT_01c7c878 + (long)*(int *)((long)&DAT_01c7c878 + lVar28));
    }
    else {
      pcVar30 = (char *)0x0;
    }
    pTVar5 = pTVar6;
    pTVar9 = (TestNode *)operator_new(0xb0);
    if (uVar26 < 10) {
      description = (char *)((long)&DAT_01c7c8a0 + (long)*(int *)((long)&DAT_01c7c8a0 + lVar28));
    }
    else {
      description = (char *)0x0;
    }
    local_2d0 = (TestNode *)CONCAT71(local_2d0._1_7_,uVar26 < 2);
    pTVar12 = (TestNode *)pTVar6[1]._vptr_TestNode;
    pbVar29 = glcts::fixed_sample_locations_values + 1;
    if (uVar26 < 2) {
      local_258 = &local_248;
      local_250 = 0;
      local_248 = local_248 & 0xffffffffffffff00;
      local_2a0 = (TestNode *)pTVar6[1]._vptr_TestNode;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      psVar15 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_298.field_2._M_allocated_capacity = *psVar15;
        local_298.field_2._8_8_ = puVar7[3];
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar15;
        local_298._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_298._M_string_length = puVar7[1];
      *puVar7 = psVar15;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_238.field_2._M_allocated_capacity = *psVar15;
        local_238.field_2._8_8_ = plVar8[3];
      }
      else {
        local_238.field_2._M_allocated_capacity = *psVar15;
        local_238._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_238._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_1a8 = (bool *)&local_198;
      pbVar29 = (bool *)(plVar8 + 2);
      if ((bool *)*plVar8 == pbVar29) {
        local_198 = *(long *)pbVar29;
        lStack_190 = plVar8[3];
      }
      else {
        local_198 = *(long *)pbVar29;
        local_1a8 = (bool *)*plVar8;
      }
      local_1a0 = plVar8[1];
      *plVar8 = (long)pbVar29;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      pTVar12 = local_2a0;
      pbVar29 = local_1a8;
    }
    tcu::TestCase::TestCase((TestCase *)pTVar9,*(TestContext **)pTVar12,pcVar30,description);
    pTVar9[1]._vptr_TestNode = (_func_int **)pTVar12;
    pTVar9->_vptr_TestNode = (_func_int **)&PTR__PerPatchDataCase_0219bad0;
    *(uint *)&pTVar9[1].m_testCtx = uVar26;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pTVar9[1].m_name,pbVar29,(allocator<char> *)&local_2f0);
    pTVar9[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar9[1].m_description._M_string_length = 0;
    tcu::TestNode::addChild((TestNode *)local_2c8,pTVar9);
    if (uVar26 < 2) {
      if (local_1a8 != (bool *)&local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
    }
    uVar26 = uVar26 + 1;
    lVar28 = lVar28 + 4;
    pTVar6 = pTVar5;
  } while (uVar26 != 10);
  uVar26 = 0;
  piVar24 = &DAT_01c7c8c8;
  do {
    if (uVar26 < 3) {
      pcVar30 = (char *)((long)&DAT_01c7c8c8 + (long)*piVar24);
    }
    else {
      pcVar30 = (char *)0x0;
    }
    pTVar6 = (TestNode *)operator_new(0xb0);
    pp_Var3 = pTVar5[1]._vptr_TestNode;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,(TestContext *)*pp_Var3,pcVar30,
               glcts::fixed_sample_locations_values + 1);
    pTVar6[1]._vptr_TestNode = pp_Var3;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__GLPositionCase_0219bb20;
    *(uint *)&pTVar6[1].m_testCtx = uVar26;
    pTVar6[1].m_name._M_dataplus._M_p = (pointer)&pTVar6[1].m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pTVar6[1].m_name,"data/tessellation/gl_position_ref.png","");
    pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
    pTVar6[1].m_description._M_string_length = 0;
    tcu::TestNode::addChild((TestNode *)local_2c8,pTVar6);
    uVar26 = uVar26 + 1;
    piVar24 = piVar24 + 1;
  } while (uVar26 != 3);
  pTVar9 = (TestNode *)operator_new(0xa8);
  pp_Var3 = pTVar5[1]._vptr_TestNode;
  pTVar6 = pTVar5;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar9,(TestContext *)*pp_Var3,"barrier","Basic barrier usage");
  pTVar9[1]._vptr_TestNode = pp_Var3;
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__BarrierCase_0219bb70;
  pTVar9[1].m_testCtx = (TestContext *)&pTVar9[1].m_name._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&pTVar9[1].m_testCtx,"data/tessellation/barrier_ref.png","");
  *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 8) = 0;
  pTVar9[1].m_description._M_dataplus._M_p = (pointer)0x0;
  tcu::TestNode::addChild((TestNode *)local_2c8,pTVar9);
  pTVar9 = (TestNode *)operator_new(0x78);
  pp_Var3 = pTVar5[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"misc_draw",
             "Miscellaneous draw-result-verifying cases");
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar9[1]._vptr_TestNode = pp_Var3;
  tcu::TestNode::addChild(pTVar5,pTVar9);
  TVar32 = TESSPRIMITIVETYPE_TRIANGLES;
  local_2c8 = (UserDefinedIOCase *)pTVar9;
  do {
    local_2a0 = (TestNode *)0x1c373ae;
    if (TVar32 == TESSPRIMITIVETYPE_TRIANGLES) {
LAB_01415e78:
      SVar22 = SPACINGMODE_EQUAL;
      ppuVar19 = &PTR_anon_var_dwarf_f64c6a_0219c388;
      do {
        local_278 = &local_268;
        local_270 = 0;
        local_268 = local_268 & 0xffffffffffffff00;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
        local_2c0 = &local_2b0;
        puVar16 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar16) {
          local_2b0 = *puVar16;
          lStack_2a8 = plVar8[3];
        }
        else {
          local_2b0 = *puVar16;
          local_2c0 = (ulong *)*plVar8;
        }
        local_2b8 = plVar8[1];
        *plVar8 = (long)puVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        puVar16 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_310.field_2._M_allocated_capacity = *puVar16;
          local_310.field_2._8_8_ = plVar8[3];
        }
        else {
          local_310.field_2._M_allocated_capacity = *puVar16;
          local_310._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_310._M_string_length = plVar8[1];
        *plVar8 = (long)puVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        plVar17 = plVar8 + 2;
        if ((pointer *)*plVar8 == (pointer *)plVar17) {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          lStack_318 = plVar8[3];
        }
        else {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar8;
        }
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar8[1];
        *plVar8 = (long)plVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_2f0.field_2._M_allocated_capacity = *psVar15;
          local_2f0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar15;
          local_2f0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278,local_268 + 1);
        }
        pBVar10 = (BasicVariousTessLevelsPosAttrCase *)operator_new(0xb0);
        _Var4._M_p = local_2f0._M_dataplus._M_p;
        pCVar2 = (Context *)pTVar5[1]._vptr_TestNode;
        local_2d0 = (TestNode *)ppuVar19;
        std::operator+(&local_310,"data/tessellation/",&local_2f0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        plVar17 = plVar8 + 2;
        if ((pointer *)*plVar8 == (pointer *)plVar17) {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          lStack_318 = plVar8[3];
        }
        else {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar8;
        }
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar8[1];
        *plVar8 = (long)plVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        anon_unknown_1::BasicVariousTessLevelsPosAttrCase::BasicVariousTessLevelsPosAttrCase
                  (pBVar10,pCVar2,_Var4._M_p,
                   "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                   ,TVar32,SVar22,
                   (char *)local_330.
                           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        (pBVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_0219bbc0;
        tcu::TestNode::addChild((TestNode *)local_2c8,(TestNode *)pBVar10);
        pTVar5 = pTVar6;
        if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          pTVar5 = pTVar6;
        }
        pTVar9 = local_2d0;
        pTVar6 = pTVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        SVar22 = SVar22 + SPACINGMODE_FRACTIONAL_ODD;
        ppuVar19 = (undefined **)((long)pTVar9 + 8);
      } while (SVar22 != SPACINGMODE_LAST);
    }
    else if (TVar32 != TESSPRIMITIVETYPE_ISOLINES) {
      if (TVar32 == TESSPRIMITIVETYPE_QUADS) {
        local_2a0 = (TestNode *)0x1c1a6be;
      }
      else {
        local_2a0 = (TestNode *)0x0;
      }
      goto LAB_01415e78;
    }
    TVar32 = TVar32 + TESSPRIMITIVETYPE_QUADS;
  } while (TVar32 != TESSPRIMITIVETYPE_LAST);
  TVar32 = TESSPRIMITIVETYPE_TRIANGLES;
  do {
    local_2a0 = (TestNode *)0x1c373ae;
    if (TVar32 == TESSPRIMITIVETYPE_TRIANGLES) {
LAB_0141622f:
      SVar22 = SPACINGMODE_EQUAL;
      ppuVar19 = &PTR_anon_var_dwarf_f64c6a_0219c388;
      do {
        local_278 = &local_268;
        local_270 = 0;
        local_268 = local_268 & 0xffffffffffffff00;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
        local_2c0 = &local_2b0;
        puVar16 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar16) {
          local_2b0 = *puVar16;
          lStack_2a8 = plVar8[3];
        }
        else {
          local_2b0 = *puVar16;
          local_2c0 = (ulong *)*plVar8;
        }
        local_2b8 = plVar8[1];
        *plVar8 = (long)puVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        puVar16 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_310.field_2._M_allocated_capacity = *puVar16;
          local_310.field_2._8_8_ = plVar8[3];
        }
        else {
          local_310.field_2._M_allocated_capacity = *puVar16;
          local_310._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_310._M_string_length = plVar8[1];
        *plVar8 = (long)puVar16;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        plVar17 = plVar8 + 2;
        if ((pointer *)*plVar8 == (pointer *)plVar17) {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          lStack_318 = plVar8[3];
        }
        else {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar8;
        }
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar8[1];
        *plVar8 = (long)plVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_2f0.field_2._M_allocated_capacity = *psVar15;
          local_2f0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar15;
          local_2f0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0 != &local_2b0) {
          operator_delete(local_2c0,local_2b0 + 1);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278,local_268 + 1);
        }
        pBVar10 = (BasicVariousTessLevelsPosAttrCase *)operator_new(0xb0);
        _Var4._M_p = local_2f0._M_dataplus._M_p;
        pCVar2 = (Context *)pTVar5[1]._vptr_TestNode;
        local_2d0 = (TestNode *)ppuVar19;
        std::operator+(&local_310,"data/tessellation/",&local_2f0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        plVar17 = plVar8 + 2;
        if ((pointer *)*plVar8 == (pointer *)plVar17) {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          lStack_318 = plVar8[3];
        }
        else {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar8;
        }
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar8[1];
        *plVar8 = (long)plVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        anon_unknown_1::BasicVariousTessLevelsPosAttrCase::BasicVariousTessLevelsPosAttrCase
                  (pBVar10,pCVar2,_Var4._M_p,
                   "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                   ,TVar32,SVar22,
                   (char *)local_330.
                           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        (pBVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_0219bc70;
        tcu::TestNode::addChild((TestNode *)local_2c8,(TestNode *)pBVar10);
        pTVar5 = pTVar6;
        if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          pTVar5 = pTVar6;
        }
        pTVar9 = local_2d0;
        pTVar6 = pTVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        SVar22 = SVar22 + SPACINGMODE_FRACTIONAL_ODD;
        ppuVar19 = (undefined **)((long)pTVar9 + 8);
      } while (SVar22 != SPACINGMODE_LAST);
    }
    else if (TVar32 != TESSPRIMITIVETYPE_ISOLINES) {
      if (TVar32 == TESSPRIMITIVETYPE_QUADS) {
        local_2a0 = (TestNode *)0x1c1a6be;
      }
      else {
        local_2a0 = (TestNode *)0x0;
      }
      goto LAB_0141622f;
    }
    TVar32 = TVar32 + TESSPRIMITIVETYPE_QUADS;
    if (TVar32 == TESSPRIMITIVETYPE_LAST) {
      SVar22 = SPACINGMODE_EQUAL;
      do {
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        local_310._M_string_length = 0;
        local_310.field_2._M_allocated_capacity =
             local_310.field_2._M_allocated_capacity & 0xffffffffffffff00;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        plVar17 = plVar8 + 2;
        if ((pointer *)*plVar8 == (pointer *)plVar17) {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          lStack_318 = plVar8[3];
        }
        else {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar8;
        }
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar8[1];
        *plVar8 = (long)plVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_2f0.field_2._M_allocated_capacity = *psVar15;
          local_2f0.field_2._8_8_ = plVar8[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar15;
          local_2f0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2f0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        pBVar10 = (BasicVariousTessLevelsPosAttrCase *)operator_new(0xb0);
        _Var4._M_p = local_2f0._M_dataplus._M_p;
        pCVar2 = (Context *)pTVar5[1]._vptr_TestNode;
        std::operator+(&local_310,"data/tessellation/",&local_2f0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        plVar17 = plVar8 + 2;
        if ((pointer *)*plVar8 == (pointer *)plVar17) {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          lStack_318 = plVar8[3];
        }
        else {
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar8;
        }
        local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar8[1];
        *plVar8 = (long)plVar17;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        anon_unknown_1::BasicVariousTessLevelsPosAttrCase::BasicVariousTessLevelsPosAttrCase
                  (pBVar10,pCVar2,_Var4._M_p,"Basic isolines render test",TESSPRIMITIVETYPE_ISOLINES
                   ,SVar22,(char *)local_330.
                                   super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        (pBVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_0219bcc8;
        pTVar5 = pTVar6;
        tcu::TestNode::addChild((TestNode *)local_2c8,(TestNode *)pBVar10);
        pTVar6 = pTVar5;
        if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&local_330.
                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        SVar22 = SVar22 + SPACINGMODE_FRACTIONAL_ODD;
      } while (SVar22 != SPACINGMODE_LAST);
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"common_edge",
                 "Draw multiple adjacent shapes and check that no cracks appear between them");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      local_2d0 = pTVar9;
      tcu::TestNode::addChild(pTVar5,pTVar9);
      uVar11 = 0;
      do {
        uVar26 = 0;
        local_2c8 = (UserDefinedIOCase *)uVar11;
        do {
          if (uVar26 != 2) {
            local_2a0 = (TestNode *)(ulong)uVar26;
            iVar31 = 0;
            do {
              local_278 = &local_268;
              local_270 = 0;
              local_268 = local_268 & 0xffffffffffffff00;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
              local_2c0 = &local_2b0;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((ulong *)*plVar8 == puVar16) {
                local_2b0 = *puVar16;
                lStack_2a8 = plVar8[3];
              }
              else {
                local_2b0 = *puVar16;
                local_2c0 = (ulong *)*plVar8;
              }
              local_2b8 = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16) {
                local_310.field_2._M_allocated_capacity = *puVar16;
                local_310.field_2._8_8_ = plVar8[3];
              }
              else {
                local_310.field_2._M_allocated_capacity = *puVar16;
                local_310._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_310._M_string_length = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)&local_330.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              plVar17 = plVar8 + 2;
              if ((pointer *)*plVar8 == (pointer *)plVar17) {
                local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
                lStack_318 = plVar8[3];
              }
              else {
                local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
                local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
              }
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[1];
              *plVar8 = (long)plVar17;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              psVar15 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_2f0.field_2._M_allocated_capacity = *psVar15;
                local_2f0.field_2._8_8_ = plVar8[3];
              }
              else {
                local_2f0.field_2._M_allocated_capacity = *psVar15;
                local_2f0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2f0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar15;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_330.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_2c0 != &local_2b0) {
                operator_delete(local_2c0,local_2b0 + 1);
              }
              if (local_278 != &local_268) {
                operator_delete(local_278,local_268 + 1);
              }
              pTVar9 = (TestNode *)operator_new(0x98);
              pp_Var3 = pTVar5[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar9,(TestContext *)*pp_Var3,local_2f0._M_dataplus._M_p,
                         glcts::fixed_sample_locations_values + 1);
              pTVar9[1]._vptr_TestNode = pp_Var3;
              pTVar9->_vptr_TestNode = (_func_int **)&PTR__CommonEdgeCase_0219bd20;
              *(uint *)&pTVar9[1].m_testCtx = uVar26;
              *(int *)((long)&pTVar9[1].m_testCtx + 4) = iVar31;
              *(int *)&pTVar9[1].m_name._M_dataplus._M_p = (int)local_2c8;
              pTVar9[1].m_name._M_string_length = 0;
              pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
              pTVar5 = pTVar6;
              tcu::TestNode::addChild(local_2d0,pTVar9);
              pTVar6 = pTVar5;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              iVar31 = iVar31 + 1;
            } while (iVar31 != 3);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != 3);
        uVar11 = (ulong)((int)local_2c8 + 1);
      } while ((int)local_2c8 == 0);
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"fractional_spacing",
                 "Test fractional spacing modes");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar5,pTVar9);
      pTVar12 = (TestNode *)operator_new(0x90);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,(TestContext *)*pp_Var3,"odd",
                 glcts::fixed_sample_locations_values + 1);
      pTVar12[1]._vptr_TestNode = pp_Var3;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__FractionalSpacingModeCase_0219bd70;
      *(undefined4 *)&pTVar12[1].m_testCtx = 1;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar12[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild(pTVar9,pTVar12);
      pTVar12 = (TestNode *)operator_new(0x90);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar12,(TestContext *)*pp_Var3,"even",
                 glcts::fixed_sample_locations_values + 1);
      pTVar12[1]._vptr_TestNode = pp_Var3;
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__FractionalSpacingModeCase_0219bd70;
      *(undefined4 *)&pTVar12[1].m_testCtx = 2;
      pTVar12[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar12[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild(pTVar9,pTVar12);
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"primitive_discard",
                 "Test primitive discard with relevant outer tessellation level <= 0.0");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      local_2a0 = pTVar9;
      tcu::TestNode::addChild(pTVar5,pTVar9);
      uVar11 = 0;
      do {
        uVar20 = 0;
        local_218 = (TestNode *)uVar11;
        do {
          uVar18 = 0;
          local_210 = (TestNode *)uVar20;
          do {
            local_2d0 = (TestNode *)0x0;
            if ((int)uVar18 == 1) {
              local_2d0 = (TestNode *)0x1ca2b2e;
            }
            if ((int)uVar18 == 0) {
              local_2d0 = (TestNode *)0x1ca2b5d;
            }
            iVar31 = 0;
            local_2c8 = (UserDefinedIOCase *)uVar18;
            do {
              pTVar9 = (TestNode *)operator_new(0x98);
              pp_Var3 = pTVar5[1]._vptr_TestNode;
              local_1c8 = &local_1b8;
              local_1c0 = 0;
              local_1b8 = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
              local_1f8 = &local_1e8;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((ulong *)*plVar8 == puVar16) {
                local_1e8 = *puVar16;
                lStack_1e0 = plVar8[3];
              }
              else {
                local_1e8 = *puVar16;
                local_1f8 = (ulong *)*plVar8;
              }
              local_1f0 = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_278 = &local_268;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((ulong *)*plVar8 == puVar16) {
                local_268 = *puVar16;
                lStack_260 = plVar8[3];
              }
              else {
                local_268 = *puVar16;
                local_278 = (ulong *)*plVar8;
              }
              local_270 = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
              local_2c0 = &local_2b0;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((ulong *)*plVar8 == puVar16) {
                local_2b0 = *puVar16;
                lStack_2a8 = plVar8[3];
              }
              else {
                local_2b0 = *puVar16;
                local_2c0 = (ulong *)*plVar8;
              }
              local_2b8 = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16) {
                local_310.field_2._M_allocated_capacity = *puVar16;
                local_310.field_2._8_8_ = plVar8[3];
              }
              else {
                local_310.field_2._M_allocated_capacity = *puVar16;
                local_310._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_310._M_string_length = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)&local_330.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              plVar17 = plVar8 + 2;
              if ((pointer *)*plVar8 == (pointer *)plVar17) {
                local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
                lStack_318 = plVar8[3];
              }
              else {
                local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
                local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
              }
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar8[1];
              *plVar8 = (long)plVar17;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              psVar15 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_2f0.field_2._M_allocated_capacity = *psVar15;
                local_2f0.field_2._8_8_ = plVar8[3];
              }
              else {
                local_2f0.field_2._M_allocated_capacity = *psVar15;
                local_2f0._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2f0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar15;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar9,(TestContext *)*pp_Var3,local_2f0._M_dataplus._M_p,
                         glcts::fixed_sample_locations_values + 1);
              pTVar9[1]._vptr_TestNode = pp_Var3;
              pTVar9->_vptr_TestNode = (_func_int **)&PTR__PrimitiveDiscardCase_0219bdc0;
              *(int *)&pTVar9[1].m_testCtx = (int)uVar11;
              *(int *)((long)&pTVar9[1].m_testCtx + 4) = (int)uVar20;
              *(int *)&pTVar9[1].m_name._M_dataplus._M_p = (int)local_2c8;
              *(char *)((long)&pTVar9[1].m_name._M_dataplus._M_p + 4) = (char)iVar31;
              pTVar9[1].m_name._M_string_length = 0;
              pTVar9[1].m_name.field_2._M_allocated_capacity = 0;
              tcu::TestNode::addChild(local_2a0,pTVar9);
              pTVar5 = pTVar6;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
                pTVar5 = pTVar6;
              }
              pTVar6 = pTVar5;
              if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_330.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_2c0 != &local_2b0) {
                operator_delete(local_2c0,local_2b0 + 1);
              }
              if (local_278 != &local_268) {
                operator_delete(local_278,local_268 + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if (local_1c8 != &local_1b8) {
                operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
              }
              iVar31 = iVar31 + 1;
            } while (iVar31 == 1);
            uVar18 = (ulong)((int)local_2c8 + 1);
          } while ((int)local_2c8 == 0);
          uVar26 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar26;
        } while (uVar26 != 3);
        uVar26 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar26;
      } while (uVar26 != 3);
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"invariance",
                 "Test tessellation invariance rules");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      pTVar12 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var3,"primitive_set",
                 "Test invariance rule #1");
      pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar12[1]._vptr_TestNode = pp_Var3;
      pTVar13 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar13,(TestContext *)*pp_Var3,"outer_edge_division",
                 "Test invariance rule #2");
      ((TestNode *)&pTVar13->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0
      ;
      ((TestNode *)&pTVar13[1]._vptr_TestNode)->_vptr_TestNode = pp_Var3;
      local_200 = pTVar13;
      pUVar14 = (UserDefinedIOCase *)operator_new(0x78);
      pCVar2 = (Context *)pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pUVar14,pCVar2->m_testCtx,"outer_edge_symmetry",
                 "Test invariance rule #3");
      (pUVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__TestCase_021985d0;
      (pUVar14->super_TestCase).m_context = pCVar2;
      local_2c8 = pUVar14;
      pTVar13 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar13,(TestContext *)*pp_Var3,"outer_edge_index_independence",
                 "Test invariance rule #4");
      ((TestNode *)&pTVar13->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0
      ;
      ((TestNode *)&pTVar13[1]._vptr_TestNode)->_vptr_TestNode = pp_Var3;
      local_218 = pTVar13;
      pTVar13 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar13,(TestContext *)*pp_Var3,"triangle_set",
                 "Test invariance rule #5");
      ((TestNode *)&pTVar13->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0
      ;
      ((TestNode *)&pTVar13[1]._vptr_TestNode)->_vptr_TestNode = pp_Var3;
      local_208 = pTVar13;
      pTVar13 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar13,(TestContext *)*pp_Var3,"inner_triangle_set",
                 "Test invariance rule #6");
      ((TestNode *)&pTVar13->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0
      ;
      ((TestNode *)&pTVar13[1]._vptr_TestNode)->_vptr_TestNode = pp_Var3;
      local_1d0 = pTVar13;
      pTVar13 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar13,(TestContext *)*pp_Var3,"outer_triangle_set",
                 "Test invariance rule #7");
      ((TestNode *)&pTVar13->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0
      ;
      ((TestNode *)&pTVar13[1]._vptr_TestNode)->_vptr_TestNode = pp_Var3;
      local_1d8 = pTVar13;
      pTVar13 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar13,(TestContext *)*pp_Var3,"tess_coord_component_range",
                 "Test invariance rule #8, first part");
      pTVar13->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar13[1]._vptr_TestNode = pp_Var3;
      node = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar5[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,(TestContext *)*pp_Var3,"one_minus_tess_coord_component",
                 "Test invariance rule #8, second part");
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      node[1]._vptr_TestNode = pp_Var3;
      tcu::TestNode::addChild(pTVar5,pTVar9);
      local_2d0 = pTVar12;
      tcu::TestNode::addChild(pTVar9,pTVar12);
      tcu::TestNode::addChild(pTVar9,local_200);
      tcu::TestNode::addChild(pTVar9,(TestNode *)local_2c8);
      tcu::TestNode::addChild(pTVar9,local_218);
      tcu::TestNode::addChild(pTVar9,local_208);
      tcu::TestNode::addChild(pTVar9,local_1d0);
      tcu::TestNode::addChild(pTVar9,local_1d8);
      tcu::TestNode::addChild(pTVar9,pTVar13);
      tcu::TestNode::addChild(pTVar9,node);
      uVar26 = 0;
      local_2a0 = pTVar13;
      local_210 = node;
      do {
        if (uVar26 < 3) {
          pcVar30 = (char *)(&DAT_0219c370)[uVar26];
        }
        else {
          pcVar30 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,pcVar30,(allocator<char> *)&local_330);
        iVar31 = 0;
        do {
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,local_2f0._M_dataplus._M_p,
                     local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
          std::__cxx11::string::append((char *)&local_310);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&local_330.
                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          plVar17 = plVar8 + 2;
          if ((pointer *)*plVar8 == (pointer *)plVar17) {
            local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
            lStack_318 = plVar8[3];
          }
          else {
            local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
            local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)*plVar8;
          }
          local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)plVar8[1];
          *plVar8 = (long)plVar17;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if (uVar26 != 2) {
            pTVar5 = (TestNode *)operator_new(0x98);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar5,(TestContext *)*pp_Var3,
                       (char *)local_330.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       glcts::fixed_sample_locations_values + 1);
            pTVar5[1]._vptr_TestNode = pp_Var3;
            pTVar5->_vptr_TestNode = (_func_int **)&PTR__InvariantOuterEdgeCase_0219be10;
            *(uint *)&pTVar5[1].m_testCtx = uVar26;
            *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
            pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x0;
            pTVar5[1].m_name._M_string_length = 0;
            pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
            tcu::TestNode::addChild(local_200,pTVar5);
            pTVar5 = (TestNode *)operator_new(0xa0);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar5,(TestContext *)*pp_Var3,
                       (char *)local_330.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       glcts::fixed_sample_locations_values + 1);
            pTVar5[1]._vptr_TestNode = pp_Var3;
            *(uint *)&pTVar5[1].m_testCtx = uVar26;
            *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
            *(undefined1 *)&pTVar5[1].m_name._M_dataplus._M_p = 0;
            *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 2;
            pTVar5[1].m_name._M_string_length = 0;
            pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
            pTVar5->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_0219be60;
            tcu::TestNode::addChild(local_208,pTVar5);
            pTVar5 = (TestNode *)operator_new(0xa0);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar5,(TestContext *)*pp_Var3,
                       (char *)local_330.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       glcts::fixed_sample_locations_values + 1);
            pTVar5[1]._vptr_TestNode = pp_Var3;
            *(uint *)&pTVar5[1].m_testCtx = uVar26;
            *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
            *(undefined1 *)&pTVar5[1].m_name._M_dataplus._M_p = 0;
            *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 2;
            pTVar5[1].m_name._M_string_length = 0;
            pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
            pTVar5->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_0219bf20;
            tcu::TestNode::addChild(local_1d0,pTVar5);
            pTVar5 = (TestNode *)operator_new(0xa0);
            pp_Var3 = pTVar6[1]._vptr_TestNode;
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar5,(TestContext *)*pp_Var3,
                       (char *)local_330.
                               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       glcts::fixed_sample_locations_values + 1);
            pTVar5[1]._vptr_TestNode = pp_Var3;
            *(uint *)&pTVar5[1].m_testCtx = uVar26;
            *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
            *(undefined1 *)&pTVar5[1].m_name._M_dataplus._M_p = 0;
            *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = 2;
            pTVar5[1].m_name._M_string_length = 0;
            pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
            pTVar5->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_0219bf80;
            tcu::TestNode::addChild(local_1d8,pTVar5);
          }
          iVar27 = 0;
          do {
            local_2c0 = &local_2b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c0,
                       local_330.
                       super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (undefined1 *)
                       ((long)local_330.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish +
                       (long)local_330.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start));
            std::__cxx11::string::append((char *)&local_2c0);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
            local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
            puVar16 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_310.field_2._M_allocated_capacity = *puVar16;
              local_310.field_2._8_8_ = plVar8[3];
            }
            else {
              local_310.field_2._M_allocated_capacity = *puVar16;
              local_310._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_310._M_string_length = plVar8[1];
            *plVar8 = (long)puVar16;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if (local_2c0 != &local_2b0) {
              operator_delete(local_2c0,local_2b0 + 1);
            }
            iVar23 = 0;
            do {
              local_2c0 = &local_2b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2c0,local_310._M_dataplus._M_p,
                         local_310._M_dataplus._M_p + local_310._M_string_length);
              std::__cxx11::string::append((char *)&local_2c0);
              pTVar5 = (TestNode *)operator_new(0xa0);
              pp_Var3 = pTVar6[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar5,(TestContext *)*pp_Var3,(char *)local_2c0,
                         glcts::fixed_sample_locations_values + 1);
              pTVar5[1]._vptr_TestNode = pp_Var3;
              *(uint *)&pTVar5[1].m_testCtx = uVar26;
              *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
              uVar21 = (undefined1)iVar23;
              *(undefined1 *)&pTVar5[1].m_name._M_dataplus._M_p = uVar21;
              *(int *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = iVar27;
              pTVar5[1].m_name._M_string_length = 0;
              pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
              pTVar5->_vptr_TestNode = (_func_int **)&PTR__PrimitiveSetInvarianceCase_0219bfe0;
              tcu::TestNode::addChild(local_2d0,pTVar5);
              pTVar5 = (TestNode *)operator_new(0x98);
              pp_Var3 = pTVar6[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar5,(TestContext *)*pp_Var3,(char *)local_2c0,
                         glcts::fixed_sample_locations_values + 1);
              pTVar5[1]._vptr_TestNode = pp_Var3;
              pTVar5->_vptr_TestNode = (_func_int **)&PTR__SymmetricOuterEdgeCase_0219c040;
              *(uint *)&pTVar5[1].m_testCtx = uVar26;
              *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
              *(int *)&pTVar5[1].m_name._M_dataplus._M_p = iVar27;
              *(undefined1 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar21;
              pTVar5[1].m_name._M_string_length = 0;
              pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
              tcu::TestNode::addChild((TestNode *)local_2c8,pTVar5);
              pTVar5 = (TestNode *)operator_new(0x98);
              pp_Var3 = pTVar6[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar5,(TestContext *)*pp_Var3,(char *)local_2c0,
                         glcts::fixed_sample_locations_values + 1);
              pTVar5[1]._vptr_TestNode = pp_Var3;
              *(uint *)&pTVar5[1].m_testCtx = uVar26;
              *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
              *(int *)&pTVar5[1].m_name._M_dataplus._M_p = iVar27;
              *(undefined1 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar21;
              pTVar5[1].m_name._M_string_length = 0;
              pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
              pTVar5->_vptr_TestNode = (_func_int **)&PTR__TessCoordComponentInvarianceCase_0219c090
              ;
              tcu::TestNode::addChild(local_2a0,pTVar5);
              pTVar5 = (TestNode *)operator_new(0x98);
              pp_Var3 = pTVar6[1]._vptr_TestNode;
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar5,(TestContext *)*pp_Var3,(char *)local_2c0,
                         glcts::fixed_sample_locations_values + 1);
              pTVar5[1]._vptr_TestNode = pp_Var3;
              *(uint *)&pTVar5[1].m_testCtx = uVar26;
              *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
              *(int *)&pTVar5[1].m_name._M_dataplus._M_p = iVar27;
              *(undefined1 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar21;
              pTVar5[1].m_name._M_string_length = 0;
              pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
              pTVar5->_vptr_TestNode = (_func_int **)&PTR__TessCoordComponentInvarianceCase_0219c150
              ;
              tcu::TestNode::addChild(local_210,pTVar5);
              if (uVar26 != 2) {
                pTVar5 = (TestNode *)operator_new(0x98);
                pp_Var3 = pTVar6[1]._vptr_TestNode;
                tcu::TestCase::TestCase
                          ((TestCase *)pTVar5,(TestContext *)*pp_Var3,(char *)local_2c0,
                           glcts::fixed_sample_locations_values + 1);
                pTVar5[1]._vptr_TestNode = pp_Var3;
                pTVar5->_vptr_TestNode =
                     (_func_int **)&PTR__OuterEdgeVertexSetIndexIndependenceCase_0219c1b0;
                *(uint *)&pTVar5[1].m_testCtx = uVar26;
                *(int *)((long)&pTVar5[1].m_testCtx + 4) = iVar31;
                *(int *)&pTVar5[1].m_name._M_dataplus._M_p = iVar27;
                *(undefined1 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar21;
                pTVar5[1].m_name._M_string_length = 0;
                pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
                tcu::TestNode::addChild(local_218,pTVar5);
              }
              if (local_2c0 != &local_2b0) {
                operator_delete(local_2c0,local_2b0 + 1);
              }
              iVar23 = iVar23 + 1;
            } while (iVar23 == 1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            bVar33 = iVar27 == 0;
            iVar27 = iVar27 + 1;
          } while (bVar33);
          if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&local_330.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_330.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          iVar31 = iVar31 + 1;
        } while (iVar31 != 3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != 3);
      pTVar5 = pTVar6;
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar6[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"user_defined_io",
                 "Test non-built-in per-patch and per-vertex inputs and outputs");
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      local_208 = pTVar9;
      tcu::TestNode::addChild(pTVar6,pTVar9);
      lVar28 = 0;
      do {
        local_200 = (TestNode *)lVar28;
        pTVar12 = (TestNode *)operator_new(0x78);
        pTVar9 = local_200;
        pp_Var3 = pTVar6[1]._vptr_TestNode;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar12,(TestContext *)*pp_Var3,
                   init::ioCases[(long)local_200].name,init::ioCases[(long)local_200].description);
        local_210 = (TestNode *)(init::ioCases + (long)pTVar9);
        pTVar12->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
        pTVar12[1]._vptr_TestNode = pp_Var3;
        local_218 = pTVar12;
        tcu::TestNode::addChild(local_208,pTVar12);
        iVar31 = 0;
        do {
          local_2d0 = (TestNode *)CONCAT44(local_2d0._4_4_,iVar31);
          pTVar9 = (TestNode *)operator_new(0x78);
          pp_Var3 = pTVar6[1]._vptr_TestNode;
          pcVar30 = "vertex_io_array_size_implicit";
          if ((IOType)local_2d0 != 0) {
            if ((IOType)local_2d0 == 1) {
              pcVar30 = "vertex_io_array_size_shader_builtin";
            }
            else {
              pcVar30 = (char *)0x0;
              if ((IOType)local_2d0 == 2) {
                pcVar30 = "vertex_io_array_size_query";
              }
            }
          }
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,pcVar30,
                     glcts::fixed_sample_locations_values + 1);
          pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
          pTVar9[1]._vptr_TestNode = pp_Var3;
          local_2a0 = pTVar9;
          tcu::TestNode::addChild(local_218,pTVar9);
          uVar26 = 0;
          puVar7 = &DAT_0219c370;
          do {
            local_2c8 = (UserDefinedIOCase *)operator_new(0x100);
            pCVar2 = (Context *)pTVar6[1]._vptr_TestNode;
            if (uVar26 < 3) {
              pcVar30 = (char *)*puVar7;
            }
            else {
              pcVar30 = (char *)0x0;
            }
            TVar32 = *(TessPrimitiveType *)&(local_210->m_name)._M_dataplus._M_p;
            local_2c0 = &local_2b0;
            local_2b8 = 0;
            local_2b0 = local_2b0 & 0xffffffffffffff00;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
            local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
            puVar16 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_310.field_2._M_allocated_capacity = *puVar16;
              local_310.field_2._8_8_ = plVar8[3];
            }
            else {
              local_310.field_2._M_allocated_capacity = *puVar16;
              local_310._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_310._M_string_length = plVar8[1];
            *plVar8 = (long)puVar16;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
            local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&local_330.
                           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
            plVar17 = plVar8 + 2;
            if ((pointer *)*plVar8 == (pointer *)plVar17) {
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
              lStack_318 = plVar8[3];
            }
            else {
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar17;
              local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar8;
            }
            local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)plVar8[1];
            *plVar8 = (long)plVar17;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
            pUVar14 = local_2c8;
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            psVar15 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_2f0.field_2._M_allocated_capacity = *psVar15;
              local_2f0.field_2._8_8_ = plVar8[3];
            }
            else {
              local_2f0.field_2._M_allocated_capacity = *psVar15;
              local_2f0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_2f0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar15;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
                      (local_2c8,pCVar2,pcVar30,(char *)(ulong)uVar26,TVar32,(IOType)local_2d0,
                       VERTEX_IO_ARRAY_SIZE_IMPLICIT,
                       (TessControlOutArraySize)local_2f0._M_dataplus._M_p,(char *)pTVar5);
            tcu::TestNode::addChild(local_2a0,(TestNode *)pUVar14);
            pTVar6 = pTVar5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
              pTVar6 = pTVar5;
            }
            pTVar5 = pTVar6;
            if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&local_330.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(local_330.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_330.
                                    super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2c0 != &local_2b0) {
              operator_delete(local_2c0,local_2b0 + 1);
            }
            uVar26 = uVar26 + 1;
            puVar7 = puVar7 + 1;
          } while (uVar26 != 3);
          IVar1 = *(IOType *)&(local_210->m_name)._M_dataplus._M_p;
          local_2c8 = (UserDefinedIOCase *)CONCAT44(local_2c8._4_4_,IVar1);
          pTVar6 = pTVar5;
          if ((IVar1 & ~IO_TYPE_PER_PATCH_ARRAY) == IO_TYPE_PER_VERTEX) {
            uVar26 = 0;
            puVar7 = &DAT_0219c370;
            do {
              pUVar14 = (UserDefinedIOCase *)operator_new(0x100);
              if (uVar26 < 3) {
                pcVar30 = (char *)*puVar7;
              }
              else {
                pcVar30 = (char *)0x0;
              }
              pCVar2 = (Context *)pTVar6[1]._vptr_TestNode;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_330,pcVar30,(allocator<char> *)&local_1c8);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_330);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              psVar15 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_2f0.field_2._M_allocated_capacity = *psVar15;
                local_2f0.field_2._8_8_ = plVar8[3];
              }
              else {
                local_2f0.field_2._M_allocated_capacity = *psVar15;
                local_2f0._M_dataplus._M_p = (pointer)*plVar8;
              }
              _Var4._M_p = local_2f0._M_dataplus._M_p;
              local_2f0._M_string_length = plVar8[1];
              *plVar8 = (long)psVar15;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              local_1f8 = &local_1e8;
              local_1f0 = 0;
              local_1e8 = local_1e8 & 0xffffffffffffff00;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_278 = &local_268;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((ulong *)*plVar8 == puVar16) {
                local_268 = *puVar16;
                lStack_260 = plVar8[3];
              }
              else {
                local_268 = *puVar16;
                local_278 = (ulong *)*plVar8;
              }
              local_270 = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
              local_2c0 = &local_2b0;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((ulong *)*plVar8 == puVar16) {
                local_2b0 = *puVar16;
                lStack_2a8 = plVar8[3];
              }
              else {
                local_2b0 = *puVar16;
                local_2c0 = (ulong *)*plVar8;
              }
              local_2b8 = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              puVar16 = (ulong *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16) {
                local_310.field_2._M_allocated_capacity = *puVar16;
                local_310.field_2._8_8_ = plVar8[3];
              }
              else {
                local_310.field_2._M_allocated_capacity = *puVar16;
                local_310._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_310._M_string_length = plVar8[1];
              *plVar8 = (long)puVar16;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
                        (pUVar14,pCVar2,_Var4._M_p,(char *)(ulong)uVar26,
                         (TessPrimitiveType)local_2c8,(IOType)local_2d0,
                         VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN,
                         (TessControlOutArraySize)local_310._M_dataplus._M_p,(char *)pTVar6);
              tcu::TestNode::addChild(local_2a0,(TestNode *)pUVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_2c0 != &local_2b0) {
                operator_delete(local_2c0,local_2b0 + 1);
              }
              if (local_278 != &local_268) {
                operator_delete(local_278,local_268 + 1);
              }
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_330.
                                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_330.
                                      super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              uVar26 = uVar26 + 1;
              puVar7 = puVar7 + 1;
            } while (uVar26 != 3);
          }
          iVar31 = (IOType)local_2d0 + 1;
          pTVar5 = pTVar6;
        } while (iVar31 != 3);
        lVar28 = (long)local_200 + 1;
      } while (lVar28 != 6);
      pTVar5 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar6[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var3,"negative","Negative cases");
      pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar5[1]._vptr_TestNode = pp_Var3;
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar6[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"es31","GLSL ES 3.1 Negative cases"
                );
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      deqp::gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)&local_2f0,pTVar6->m_testCtx,
                 (RenderContext *)pTVar6[1]._vptr_TestNode[1],
                 (ContextInfo *)pTVar6[1]._vptr_TestNode[2]);
      deqp::gls::ShaderLibrary::loadShaderFile
                (&local_330,(ShaderLibrary *)&local_2f0,
                 "shaders/es31/tessellation_negative_user_defined_io.test");
      if (0 < (int)((ulong)((long)local_330.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_330.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar28 = 0;
        do {
          tcu::TestNode::addChild
                    (pTVar9,local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 < (int)((ulong)((long)local_330.
                                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_330.
                                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      tcu::TestNode::addChild(pTVar5,pTVar9);
      if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_330.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_330.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_330.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&local_2f0);
      pTVar9 = (TestNode *)operator_new(0x78);
      pp_Var3 = pTVar6[1]._vptr_TestNode;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,(TestContext *)*pp_Var3,"es32","GLSL ES 3.2 Negative cases"
                );
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
      pTVar9[1]._vptr_TestNode = pp_Var3;
      deqp::gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)&local_2f0,pTVar6->m_testCtx,
                 (RenderContext *)pTVar6[1]._vptr_TestNode[1],
                 (ContextInfo *)pTVar6[1]._vptr_TestNode[2]);
      deqp::gls::ShaderLibrary::loadShaderFile
                (&local_330,(ShaderLibrary *)&local_2f0,
                 "shaders/es32/tessellation_negative_user_defined_io.test");
      pTVar6 = local_208;
      if (0 < (int)((ulong)((long)local_330.
                                  super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_330.
                                 super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        lVar28 = 0;
        do {
          tcu::TestNode::addChild
                    (pTVar9,local_330.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 < (int)((ulong)((long)local_330.
                                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_330.
                                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      tcu::TestNode::addChild(pTVar5,pTVar9);
      if (local_330.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_330.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_330.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_330.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)&local_2f0);
      tcu::TestNode::addChild(pTVar6,pTVar5);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TessellationTests::init (void)
{
	{
		tcu::TestCaseGroup* const queryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "Query tests");
		addChild(queryGroup);

		// new limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_patch_vertices",								"Test MAX_PATCH_VERTICES",								GL_MAX_PATCH_VERTICES,							32));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_gen_level",								"Test MAX_TESS_GEN_LEVEL",								GL_MAX_TESS_GEN_LEVEL,							64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_components",				"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",				GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS,			1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_components",			"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",			GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS,		1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_texture_image_units",				"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_texture_image_units",			"Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_output_components",				"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_patch_components",							"Test MAX_TESS_PATCH_COMPONENTS",						GL_MAX_TESS_PATCH_COMPONENTS,					120));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_total_output_components",			"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",		GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS,	2048));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_output_components",				"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_blocks",					"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",					GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,				12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_blocks",				"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",				GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_input_components",					"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_INPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_input_components",				"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counter_buffers",			"Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",			GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counter_buffers",		"Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",		GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS,	0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counters",					"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",				GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counters",				"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",				GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_image_uniforms",					"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",					GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS,				0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_image_uniforms",				"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",				GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_shader_storage_blocks",			"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",			GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_shader_storage_blocks",			"Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",		GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS,	0));

		// modified limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_uniform_buffer_bindings",						"Test MAX_UNIFORM_BUFFER_BINDINGS",						GL_MAX_UNIFORM_BUFFER_BINDINGS,					72));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_uniform_blocks",						"Test MAX_COMBINED_UNIFORM_BLOCKS",						GL_MAX_COMBINED_UNIFORM_BLOCKS,					60));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_texture_image_units",					"Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",				GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,			96));

		// combined limits
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_control_uniform_components",		"Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS,		GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,		GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS));
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_evaluation_uniform_components",		"Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS,		GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,	GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS));

		// features
		queryGroup->addChild(new PrimitiveRestartForPatchesSupportedCase(m_context, "primitive_restart_for_patches_supported", "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED"));

		// states
		queryGroup->addChild(new PatchVerticesStateCase(m_context, "patch_vertices", "Test PATCH_VERTICES"));

		// program states
		queryGroup->addChild(new TessControlOutputVerticesCase	(m_context, "tess_control_output_vertices",	"Test TESS_CONTROL_OUTPUT_VERTICES"));
		queryGroup->addChild(new TessGenModeQueryCase			(m_context, "tess_gen_mode",				"Test TESS_GEN_MODE"));
		queryGroup->addChild(new TessGenSpacingQueryCase		(m_context, "tess_gen_spacing",				"Test TESS_GEN_SPACING"));
		queryGroup->addChild(new TessGenVertexOrderQueryCase	(m_context, "tess_gen_vertex_order",		"Test TESS_GEN_VERTEX_ORDER"));
		queryGroup->addChild(new TessGenPointModeQueryCase		(m_context, "tess_gen_point_mode",			"Test TESS_GEN_POINT_MODE"));

		// resource queries
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_control_shader",	"Test REFERENCED_BY_TESS_CONTROL_SHADER",		true));
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_evaluation_shader",	"Test REFERENCED_BY_TESS_EVALUATION_SHADER",	false));
		queryGroup->addChild(new IsPerPatchQueryCase				(m_context, "is_per_patch",							"Test IS_PER_PATCH"));
	}

	{
		TestCaseGroup* const tessCoordGroup = new TestCaseGroup(m_context, "tesscoord", "Get tessellation coordinates with transform feedback and validate them");
		addChild(tessCoordGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				tessCoordGroup->addChild(new TessCoordCase(m_context,
														   (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName((SpacingMode)spacingI)).c_str(), "",
														   primitiveType, (SpacingMode)spacingI));
		}
	}

	{
		TestCaseGroup* const windingGroup = new TestCaseGroup(m_context, "winding", "Test the cw and ccw input layout qualifiers");
		addChild(windingGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			for (int windingI = 0; windingI < WINDING_LAST; windingI++)
			{
				const Winding winding = (Winding)windingI;
				windingGroup->addChild(new WindingCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getWindingShaderName(winding)).c_str(), "", primitiveType, winding));
			}
		}
	}

	{
		TestCaseGroup* const shaderInputOutputGroup = new TestCaseGroup(m_context, "shader_input_output", "Test tessellation control and evaluation shader inputs and outputs");
		addChild(shaderInputOutputGroup);

		{
			static const struct
			{
				int inPatchSize;
				int outPatchSize;
			} patchVertexCountCases[] =
			{
				{  5, 10 },
				{ 10,  5 }
			};

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(patchVertexCountCases); caseNdx++)
			{
				const int inSize	= patchVertexCountCases[caseNdx].inPatchSize;
				const int outSize	= patchVertexCountCases[caseNdx].outPatchSize;

				const string caseName = "patch_vertices_" + de::toString(inSize) + "_in_" + de::toString(outSize) + "_out";

				shaderInputOutputGroup->addChild(new PatchVertexCountCase(m_context, caseName.c_str(), "Test input and output patch vertex counts", inSize, outSize,
																		  ("data/tessellation/" + caseName + "_ref.png").c_str()));
			}
		}

		for (int caseTypeI = 0; caseTypeI < PerPatchDataCase::CASETYPE_LAST; caseTypeI++)
		{
			const PerPatchDataCase::CaseType	caseType	= (PerPatchDataCase::CaseType)caseTypeI;
			const char* const					caseName	= PerPatchDataCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new PerPatchDataCase(m_context, caseName, PerPatchDataCase::getCaseTypeDescription(caseType), caseType,
																  PerPatchDataCase::caseTypeUsesRefImageFromFile(caseType) ? (string() + "data/tessellation/" + caseName + "_ref.png").c_str() : DE_NULL));
		}

		for (int caseTypeI = 0; caseTypeI < GLPositionCase::CASETYPE_LAST; caseTypeI++)
		{
			const GLPositionCase::CaseType	caseType	= (GLPositionCase::CaseType)caseTypeI;
			const char* const				caseName	= GLPositionCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new GLPositionCase(m_context, caseName, "", caseType, "data/tessellation/gl_position_ref.png"));
		}

		shaderInputOutputGroup->addChild(new BarrierCase(m_context, "barrier", "Basic barrier usage", "data/tessellation/barrier_ref.png"));
	}

	{
		TestCaseGroup* const miscDrawGroup = new TestCaseGroup(m_context, "misc_draw", "Miscellaneous draw-result-verifying cases");
		addChild(miscDrawGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_cover_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillCoverCase(m_context,
																	   caseName.c_str(), "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
																	   primitiveType, (SpacingMode)spacingI,
																	   ("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_overlap_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillNonOverlapCase(m_context,
																			caseName.c_str(), "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
																			primitiveType, (SpacingMode)spacingI,
																			("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
		{
			const string caseName = string() + "isolines_" + getSpacingModeShaderName((SpacingMode)spacingI);

			miscDrawGroup->addChild(new IsolinesRenderCase(m_context,
														   caseName.c_str(), "Basic isolines render test",
														   (SpacingMode)spacingI,
														   ("data/tessellation/" + caseName + "_ref").c_str()));
		}
	}

	{
		TestCaseGroup* const commonEdgeGroup = new TestCaseGroup(m_context, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them");
		addChild(commonEdgeGroup);

		for (int caseTypeI = 0; caseTypeI < CommonEdgeCase::CASETYPE_LAST; caseTypeI++)
		{
			for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
			{
				const CommonEdgeCase::CaseType	caseType		= (CommonEdgeCase::CaseType)caseTypeI;
				const TessPrimitiveType			primitiveType	= (TessPrimitiveType)primitiveTypeI;
				if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
						continue;

				for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				{
					const SpacingMode	spacing		= (SpacingMode)spacingI;
					const string		caseName	= (string() + getTessPrimitiveTypeShaderName(primitiveType)
																+ "_" + getSpacingModeShaderName(spacing)
																+ (caseType == CommonEdgeCase::CASETYPE_BASIC		? ""
																 : caseType == CommonEdgeCase::CASETYPE_PRECISE		? "_precise"
																 : DE_NULL));

					commonEdgeGroup->addChild(new CommonEdgeCase(m_context, caseName.c_str(), "", primitiveType, spacing, caseType));
				}
			}
		}
	}

	{
		TestCaseGroup* const fractionalSpacingModeGroup = new TestCaseGroup(m_context, "fractional_spacing", "Test fractional spacing modes");
		addChild(fractionalSpacingModeGroup);

		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "odd",	"", SPACINGMODE_FRACTIONAL_ODD));
		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "even",	"", SPACINGMODE_FRACTIONAL_EVEN));
	}

	{
		TestCaseGroup* const primitiveDiscardGroup = new TestCaseGroup(m_context, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0");
		addChild(primitiveDiscardGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
						const SpacingMode			spacing			= (SpacingMode)spacingI;
						const Winding				winding			= (Winding)windingI;
						const bool					usePointMode	= usePointModeI != 0;

						primitiveDiscardGroup->addChild(new PrimitiveDiscardCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType)
																									  + "_" + getSpacingModeShaderName(spacing)
																									  + "_" + getWindingShaderName(winding)
																									  + (usePointMode ? "_point_mode" : "")).c_str(), "",
																				 primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		TestCaseGroup* const invarianceGroup							= new TestCaseGroup(m_context, "invariance",						"Test tessellation invariance rules");

		TestCaseGroup* const invariantPrimitiveSetGroup					= new TestCaseGroup(m_context, "primitive_set",						"Test invariance rule #1");
		TestCaseGroup* const invariantOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_division",				"Test invariance rule #2");
		TestCaseGroup* const symmetricOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_symmetry",				"Test invariance rule #3");
		TestCaseGroup* const outerEdgeVertexSetIndexIndependenceGroup	= new TestCaseGroup(m_context, "outer_edge_index_independence",		"Test invariance rule #4");
		TestCaseGroup* const invariantTriangleSetGroup					= new TestCaseGroup(m_context, "triangle_set",						"Test invariance rule #5");
		TestCaseGroup* const invariantInnerTriangleSetGroup				= new TestCaseGroup(m_context, "inner_triangle_set",				"Test invariance rule #6");
		TestCaseGroup* const invariantOuterTriangleSetGroup				= new TestCaseGroup(m_context, "outer_triangle_set",				"Test invariance rule #7");
		TestCaseGroup* const tessCoordComponentRangeGroup				= new TestCaseGroup(m_context, "tess_coord_component_range",		"Test invariance rule #8, first part");
		TestCaseGroup* const oneMinusTessCoordComponentGroup			= new TestCaseGroup(m_context, "one_minus_tess_coord_component",	"Test invariance rule #8, second part");

		addChild(invarianceGroup);
		invarianceGroup->addChild(invariantPrimitiveSetGroup);
		invarianceGroup->addChild(invariantOuterEdgeGroup);
		invarianceGroup->addChild(symmetricOuterEdgeGroup);
		invarianceGroup->addChild(outerEdgeVertexSetIndexIndependenceGroup);
		invarianceGroup->addChild(invariantTriangleSetGroup);
		invarianceGroup->addChild(invariantInnerTriangleSetGroup);
		invarianceGroup->addChild(invariantOuterTriangleSetGroup);
		invarianceGroup->addChild(tessCoordComponentRangeGroup);
		invarianceGroup->addChild(oneMinusTessCoordComponentGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
			const string				primName		= getTessPrimitiveTypeShaderName(primitiveType);
			const bool					triOrQuad		= primitiveType == TESSPRIMITIVETYPE_TRIANGLES || primitiveType == TESSPRIMITIVETYPE_QUADS;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const SpacingMode	spacing			= (SpacingMode)spacingI;
				const string		primSpacName	= primName + "_" + getSpacingModeShaderName(spacing);

				if (triOrQuad)
				{
					invariantOuterEdgeGroup->addChild		(new InvariantOuterEdgeCase			(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantTriangleSetGroup->addChild		(new InvariantTriangleSetCase		(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantInnerTriangleSetGroup->addChild(new InvariantInnerTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantOuterTriangleSetGroup->addChild(new InvariantOuterTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
				}

				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					const Winding	winding				= (Winding)windingI;
					const string	primSpacWindName	= primSpacName + "_" + getWindingShaderName(winding);

					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const bool		usePointMode			= usePointModeI != 0;
						const string	primSpacWindPointName	= primSpacWindName + (usePointMode ? "_point_mode" : "");

						invariantPrimitiveSetGroup->addChild		(new InvariantPrimitiveSetCase			(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						symmetricOuterEdgeGroup->addChild			(new SymmetricOuterEdgeCase				(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						tessCoordComponentRangeGroup->addChild		(new TessCoordComponentRangeCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						oneMinusTessCoordComponentGroup->addChild	(new OneMinusTessCoordComponentCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));

						if (triOrQuad)
							outerEdgeVertexSetIndexIndependenceGroup->addChild(new OuterEdgeVertexSetIndexIndependenceCase(m_context, primSpacWindPointName.c_str(), "",
																														   primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		static const struct
		{
			const char*					name;
			const char*					description;
			UserDefinedIOCase::IOType	ioType;
		} ioCases[] =
		{
			{ "per_patch",					"Per-patch TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_PATCH				},
			{ "per_patch_array",			"Per-patch array TCS outputs",				UserDefinedIOCase::IO_TYPE_PER_PATCH_ARRAY			},
			{ "per_patch_block",			"Per-patch TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK			},
			{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
			{ "per_vertex",					"Per-vertex TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_VERTEX				},
			{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK			},
		};

		TestCaseGroup* const userDefinedIOGroup = new TestCaseGroup(m_context, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs");
		addChild(userDefinedIOGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ioCases); ++ndx)
		{
			TestCaseGroup* const ioTypeGroup = new TestCaseGroup(m_context, ioCases[ndx].name, ioCases[ndx].description);
			userDefinedIOGroup->addChild(ioTypeGroup);

			for (int vertexArraySizeI = 0; vertexArraySizeI < UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_LAST; vertexArraySizeI++)
			{
				const UserDefinedIOCase::VertexIOArraySize	vertexArraySize			= (UserDefinedIOCase::VertexIOArraySize)vertexArraySizeI;
				TestCaseGroup* const						vertexArraySizeGroup	= new TestCaseGroup(m_context,
																										vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_IMPLICIT
																											? "vertex_io_array_size_implicit"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN
																											? "vertex_io_array_size_shader_builtin"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY
																											? "vertex_io_array_size_query"
																									  : DE_NULL,
																									    "");
				ioTypeGroup->addChild(vertexArraySizeGroup);

				for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
				{
					const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
					vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, getTessPrimitiveTypeShaderName(primitiveType), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_IMPLICIT,
																		 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
				}

				if (ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX
					|| ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK)
				{
					for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
					{
						const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
						vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, (string(getTessPrimitiveTypeShaderName(primitiveType)) + "_explicit_tcs_out_size").c_str(), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT,
																			 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
					}
				}
			}
		}

		{
			de::MovePtr<TestCaseGroup>	negativeGroup	(new TestCaseGroup(m_context, "negative", "Negative cases"));

			{
				de::MovePtr<TestCaseGroup>			es31Group		(new TestCaseGroup(m_context, "es31", "GLSL ES 3.1 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es31Group->addChild(children[i]);

				negativeGroup->addChild(es31Group.release());
			}

			{
				de::MovePtr<TestCaseGroup>			es32Group		(new TestCaseGroup(m_context, "es32", "GLSL ES 3.2 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es32Group->addChild(children[i]);

				negativeGroup->addChild(es32Group.release());
			}

			userDefinedIOGroup->addChild(negativeGroup.release());
		}
	}
}